

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.cc
# Opt level: O3

FindInfo absl::lts_20250127::container_internal::HashSetResizeHelper::FindFirstNonFullAfterResize
                   (CommonFields *c,size_t old_capacity,size_t hash)

{
  FindInfo FVar1;
  
  if (c->capacity_ < 0x11 && old_capacity < c->capacity_) {
    __assert_fail("IsEmpty(c.control()[offset])",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.cc"
                  ,0x263,
                  "static FindInfo absl::container_internal::HashSetResizeHelper::FindFirstNonFullAfterResize(const CommonFields &, size_t, size_t)"
                 );
  }
  FVar1 = find_first_non_full<void>(c,hash);
  return FVar1;
}

Assistant:

FindInfo HashSetResizeHelper::FindFirstNonFullAfterResize(const CommonFields& c,
                                                          size_t old_capacity,
                                                          size_t hash) {
  size_t new_capacity = c.capacity();
  if (!IsGrowingIntoSingleGroupApplicable(old_capacity, new_capacity)) {
    return find_first_non_full(c, hash);
  }

  // We put the new element either at the beginning or at the end of the table
  // with approximately equal probability.
  size_t offset =
      SingleGroupTableH1(hash, c.control()) & 1 ? 0 : new_capacity - 1;

  assert(IsEmpty(c.control()[offset]));
  return FindInfo{offset, 0};
}